

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

void __thiscall QHeaderViewPrivate::initializeIndexMapping(QHeaderViewPrivate *this)

{
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  long size;
  QList<int> *this_00;
  reference piVar4;
  long in_RDI;
  int s;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QList<int> *in_stack_ffffffffffffffd0;
  int local_c;
  
  qVar3 = QList<int>::size((QList<int> *)(in_RDI + 0x558));
  iVar1 = sectionCount((QHeaderViewPrivate *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (qVar3 == iVar1) {
    qVar3 = QList<int>::size((QList<int> *)(in_RDI + 0x570));
    iVar1 = sectionCount((QHeaderViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (qVar3 == iVar1) {
      return;
    }
  }
  size = in_RDI + 0x558;
  sectionCount((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QList<int>::resize(in_stack_ffffffffffffffd0,size);
  this_00 = (QList<int> *)(in_RDI + 0x570);
  sectionCount((QHeaderViewPrivate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QList<int>::resize(this_00,size);
  local_c = 0;
  while (iVar1 = local_c,
        iVar2 = sectionCount((QHeaderViewPrivate *)CONCAT44(local_c,in_stack_ffffffffffffffc0)),
        iVar1 < iVar2) {
    iVar2 = local_c;
    piVar4 = QList<int>::operator[]
                       ((QList<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                        CONCAT44(local_c,in_stack_ffffffffffffffb8));
    *piVar4 = iVar2;
    in_stack_ffffffffffffffc0 = local_c;
    piVar4 = QList<int>::operator[]
                       ((QList<int> *)CONCAT44(iVar1,local_c),
                        CONCAT44(iVar2,in_stack_ffffffffffffffb8));
    *piVar4 = in_stack_ffffffffffffffc0;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

inline void initializeIndexMapping() const {
        if (visualIndices.size() != sectionCount()
            || logicalIndices.size() != sectionCount()) {
            visualIndices.resize(sectionCount());
            logicalIndices.resize(sectionCount());
            for (int s = 0; s < sectionCount(); ++s) {
                visualIndices[s] = s;
                logicalIndices[s] = s;
            }
        }
    }